

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

char * __thiscall
sentencepiece::ModelProto::_InternalParse(ModelProto *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *pPVar1;
  bool bVar2;
  ParseContext *ptr_00;
  ModelProto_SentencePiece *msg;
  TrainerSpec *msg_00;
  SelfTestData *msg_01;
  NormalizerSpec *pNVar3;
  ulong tag_01;
  ModelProto *containing_type;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar4;
  HasBits<1UL> *local_58;
  uint local_50;
  HasBits<1UL> local_4c;
  uint32 tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  ModelProto *this_local;
  string *local_28;
  InternalMetadata *local_20;
  HasBits<1UL> *local_18;
  InternalMetadata *local_10;
  
  local_58 = &local_4c;
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  local_18 = local_58;
  do {
    local_58->has_bits_[0] = 0;
    local_58 = local_58 + 1;
  } while (local_58 != (HasBits<1UL> *)&tag);
LAB_002cd7a7:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(_tag,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_002cdb59;
    ptr_00 = (ParseContext *)google::protobuf::internal::ReadTag((char *)ctx_local,&local_50,0);
    pPVar1 = _tag;
    tag_00 = local_50;
    if (ptr_00 == (ParseContext *)0x0) goto LAB_002cdb77;
    ctx_local = ptr_00;
    switch(local_50 >> 3) {
    case 1:
      if ((local_50 & 0xff) == 10) {
        ctx_local = (ParseContext *)((long)&ptr_00[-1].data_.factory + 7);
        do {
          pPVar1 = _tag;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg = _internal_add_pieces(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::
                      ParseMessage<sentencepiece::ModelProto_SentencePiece>
                                (pPVar1,msg,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) goto LAB_002cdb77;
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&_tag->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar2));
        goto LAB_002cd7a7;
      }
      break;
    case 2:
      if ((local_50 & 0xff) != 0x12) break;
      msg_00 = _internal_mutable_trainer_spec(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage<sentencepiece::TrainerSpec>
                            (pPVar1,msg_00,(char *)ctx_local);
      goto joined_r0x002cda0c;
    case 3:
      if ((local_50 & 0xff) == 0x1a) {
        pNVar3 = _internal_mutable_normalizer_spec(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::
                    ParseMessage<sentencepiece::NormalizerSpec>(pPVar1,pNVar3,(char *)ctx_local);
        goto joined_r0x002cda0c;
      }
      break;
    case 4:
      if ((local_50 & 0xff) == 0x22) {
        msg_01 = _internal_mutable_self_test_data(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::
                    ParseMessage<sentencepiece::SelfTestData>(pPVar1,msg_01,(char *)ctx_local);
        goto joined_r0x002cda0c;
      }
      break;
    case 5:
      if ((local_50 & 0xff) == 0x2a) {
        pNVar3 = _internal_mutable_denormalizer_spec(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::ParseContext::
                    ParseMessage<sentencepiece::NormalizerSpec>(pPVar1,pNVar3,(char *)ctx_local);
        goto joined_r0x002cda0c;
      }
    }
    if (((local_50 & 7) == 4) || (local_50 == 0)) {
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&_tag->super_EpsCopyInputStream,local_50);
      goto LAB_002cdb59;
    }
    if (local_50 < 0x640) {
      this_local = (ModelProto *)&(this->super_MessageLite)._internal_metadata_;
      local_20 = (InternalMetadata *)this_local;
      local_10 = (InternalMetadata *)this_local;
      if (((uint)((InternalMetadata *)this_local)->ptr_ & 1) == 1) {
        pCVar4 = google::protobuf::internal::InternalMetadata::
                 PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                           ((InternalMetadata *)this_local);
        local_28 = &pCVar4->unknown_fields;
      }
      else {
        local_28 = google::protobuf::internal::InternalMetadata::
                   mutable_unknown_fields_slow<std::__cxx11::string>((InternalMetadata *)this_local)
        ;
      }
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (tag_00,local_28,(char *)ctx_local,_tag);
    }
    else {
      tag_01 = (ulong)local_50;
      containing_type = internal_default_instance();
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ExtensionSet::ParseField
                            (&this->_extensions_,tag_01,(char *)ptr_00,
                             &containing_type->super_MessageLite,
                             &(this->super_MessageLite)._internal_metadata_,_tag);
    }
joined_r0x002cda0c:
    if (ctx_local == (ParseContext *)0x0) {
LAB_002cdb77:
      ctx_local = (ParseContext *)0x0;
LAB_002cdb59:
      google::protobuf::internal::HasBits<1UL>::Or(&this->_has_bits_,&local_4c);
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* ModelProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.TrainerSpec trainer_spec = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_trainer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_normalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.SelfTestData self_test_data = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_self_test_data(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_denormalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}